

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int libssh2_channel_wait_eof(LIBSSH2_CHANNEL *channel)

{
  LIBSSH2_SESSION *pLVar1;
  int iVar2;
  time_t start_time;
  char *errmsg;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  start_time = time((time_t *)0x0);
  do {
    if (channel->wait_eof_state == libssh2_NB_state_idle) {
      channel->wait_eof_state = libssh2_NB_state_created;
    }
    pLVar1 = channel->session;
    do {
      if ((channel->remote).eof != '\0') {
        channel->wait_eof_state = libssh2_NB_state_idle;
        return 0;
      }
      if ((channel->read_avail == (ulong)(channel->remote).window_size) &&
         (pLVar1->api_block_mode != 0)) {
        iVar2 = -0x2f;
        errmsg = "Receiving channel window has been exhausted";
        goto LAB_00120dbb;
      }
      iVar2 = _libssh2_transport_read(pLVar1);
      if (iVar2 == -0x25) goto LAB_00120dc5;
    } while (-1 < iVar2);
    channel->wait_eof_state = libssh2_NB_state_idle;
    errmsg = "_libssh2_transport_read() bailed out";
LAB_00120dbb:
    iVar2 = _libssh2_error(pLVar1,iVar2,errmsg);
    if (iVar2 != -0x25) {
      return iVar2;
    }
LAB_00120dc5:
    pLVar1 = channel->session;
    if ((pLVar1 == (LIBSSH2_SESSION *)0x0) || (pLVar1->api_block_mode == 0)) {
      return -0x25;
    }
    iVar2 = _libssh2_wait_socket(pLVar1,start_time);
    if (iVar2 != 0) {
      return iVar2;
    }
  } while( true );
}

Assistant:

static int channel_wait_eof(LIBSSH2_CHANNEL *channel)
{
    LIBSSH2_SESSION *session = channel->session;
    int rc;

    if(channel->wait_eof_state == libssh2_NB_state_idle) {
        _libssh2_debug((session, LIBSSH2_TRACE_CONN,
                       "Awaiting EOF for channel %u/%u", channel->local.id,
                       channel->remote.id));

        channel->wait_eof_state = libssh2_NB_state_created;
    }

    /*
     * While channel is not eof, read more packets from the network.
     * Either the EOF will be set or network timeout will occur.
     */
    do {
        if(channel->remote.eof) {
            break;
        }

        if((channel->remote.window_size == channel->read_avail) &&
            session->api_block_mode)
            return _libssh2_error(session, LIBSSH2_ERROR_CHANNEL_WINDOW_FULL,
                                  "Receiving channel window "
                                  "has been exhausted");

        rc = _libssh2_transport_read(session);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc < 0) {
            channel->wait_eof_state = libssh2_NB_state_idle;
            return _libssh2_error(session, rc,
                                  "_libssh2_transport_read() bailed out");
        }
    } while(1);

    channel->wait_eof_state = libssh2_NB_state_idle;

    return 0;
}